

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O3

bool tryProcessParamWarning(char *flag,uint8_t param,WarningState state)

{
  anon_struct_16_3_e9a1e028 *paVar1;
  int iVar2;
  WarningState WVar3;
  long lVar4;
  byte bVar5;
  anon_struct_16_3_e9a1e028 *paVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar2 = strcmp("numeric-string",flag);
  if (iVar2 == 0) {
    paVar6 = paramWarnings;
    lVar4 = 0x10;
    bVar8 = true;
  }
  else {
    lVar4 = 0x10;
    uVar7 = 0xffffffffffffffff;
    paVar6 = paramWarnings;
    do {
      if (uVar7 == 1) {
        return false;
      }
      paVar1 = paVar6 + 1;
      paVar6 = paVar6 + 1;
      iVar2 = strcmp(paVar1->name,flag);
      lVar4 = lVar4 + 2;
      uVar7 = uVar7 + 1;
    } while (iVar2 != 0);
    bVar8 = uVar7 < 2;
  }
  if (param == '\0' && state != WARNING_DISABLED) {
    bVar5 = paVar6->defaultLevel;
  }
  else {
    bVar5 = param;
    if ((2 < param) && (bVar5 = 2, param != 0xff)) {
      warnx("Got parameter %u for warning flag \"%s\", but the maximum is %u; capping.\n",
            (ulong)param,flag,2);
    }
  }
  WVar3 = state;
  if (bVar5 == 0) {
    WVar3 = WARNING_DISABLED;
  }
  warningStates[lVar4] = WVar3;
  WVar3 = WARNING_DISABLED;
  if (1 < bVar5) {
    WVar3 = state;
  }
  warningStates[lVar4 + 1] = WVar3;
  return bVar8;
}

Assistant:

static bool tryProcessParamWarning(char const *flag, uint8_t param, enum WarningState state)
{
	enum WarningID baseID = PARAM_WARNINGS_START;

	for (size_t i = 0; i < ARRAY_SIZE(paramWarnings); i++) {
		uint8_t maxParam = paramWarnings[i].nbLevels;

		if (!strcmp(paramWarnings[i].name, flag)) { // Match!
			// If making the warning an error but param is 0, set to the maximum
			// This accommodates `-Werror=flag`, but also `-Werror=flag=0`, which is
			// thus filtered out by the caller.
			// A param of 0 makes sense for disabling everything, but neither for
			// enabling nor "erroring". Use the default for those.
			if (param == 0 && state != WARNING_DISABLED) {
				param = paramWarnings[i].defaultLevel;
			} else if (param > maxParam) {
				if (param != 255) // Don't  warn if already capped
					warnx("Got parameter %" PRIu8
					      " for warning flag \"%s\", but the maximum is %"
					      PRIu8 "; capping.\n",
					      param, flag, maxParam);
				param = maxParam;
			}

			// Set the first <param> to enabled/error, and disable the rest
			for (uint8_t ofs = 0; ofs < maxParam; ofs++) {
				warningStates[baseID + ofs] =
					ofs < param ? state : WARNING_DISABLED;
			}
			return true;
		}

		baseID = (enum WarningID)(baseID + maxParam);
	}
	return false;
}